

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

void quicly_get_max_data(quicly_conn_t *conn,uint64_t *send_permitted,uint64_t *sent,
                        uint64_t *consumed)

{
  if (send_permitted != (uint64_t *)0x0) {
    *send_permitted = (conn->egress).max_data.permitted;
  }
  if (sent != (uint64_t *)0x0) {
    *sent = (conn->egress).max_data.sent;
  }
  if (consumed != (uint64_t *)0x0) {
    *consumed = (conn->ingress).max_data.bytes_consumed;
  }
  return;
}

Assistant:

void quicly_get_max_data(quicly_conn_t *conn, uint64_t *send_permitted, uint64_t *sent, uint64_t *consumed)
{
    if (send_permitted != NULL)
        *send_permitted = conn->egress.max_data.permitted;
    if (sent != NULL)
        *sent = conn->egress.max_data.sent;
    if (consumed != NULL)
        *consumed = conn->ingress.max_data.bytes_consumed;
}